

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void google::protobuf::internal::MapFieldBase::SwapPayload(MapFieldBase *lhs,MapFieldBase *rhs)

{
  Arena *pAVar1;
  Arena *pAVar2;
  ReflectionPayload *local_28;
  ReflectionPayload *p2;
  ReflectionPayload *p1;
  MapFieldBase *rhs_local;
  MapFieldBase *lhs_local;
  
  pAVar1 = arena(lhs);
  pAVar2 = arena(rhs);
  if (pAVar1 == pAVar2) {
    SwapRelaxed<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr>
              ((atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr> *)lhs,
               (atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr> *)rhs);
  }
  else {
    p2 = maybe_payload(lhs);
    local_28 = maybe_payload(rhs);
    if ((p2 != (ReflectionPayload *)0x0) || (local_28 != (ReflectionPayload *)0x0)) {
      if (p2 == (ReflectionPayload *)0x0) {
        p2 = payload(lhs);
      }
      if (local_28 == (ReflectionPayload *)0x0) {
        local_28 = payload(rhs);
      }
      RepeatedPtrField<google::protobuf::Message>::Swap
                (&p2->repeated_field,&local_28->repeated_field);
      SwapRelaxed<google::protobuf::internal::MapFieldBase::State>(&p2->state,&local_28->state);
    }
  }
  return;
}

Assistant:

void MapFieldBase::SwapPayload(MapFieldBase& lhs, MapFieldBase& rhs) {
  if (lhs.arena() == rhs.arena()) {
    SwapRelaxed(lhs.payload_, rhs.payload_);
    return;
  }
  auto* p1 = lhs.maybe_payload();
  auto* p2 = rhs.maybe_payload();
  if (p1 == nullptr && p2 == nullptr) return;

  if (p1 == nullptr) p1 = &lhs.payload();
  if (p2 == nullptr) p2 = &rhs.payload();
  p1->repeated_field.Swap(&p2->repeated_field);
  SwapRelaxed(p1->state, p2->state);
}